

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_parser.cpp
# Opt level: O3

void __thiscall
Parser_parseModelWithComponentsWithMultipleMathElements_Test::
~Parser_parseModelWithComponentsWithMultipleMathElements_Test
          (Parser_parseModelWithComponentsWithMultipleMathElements_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Parser, parseModelWithComponentsWithMultipleMathElements)
{
    // This test resulted from https://github.com/cellml/libcellml/issues/183
    const std::string e1 =
        "<math xmlns=\"http://www.w3.org/1998/Math/MathML\">\n"
        "\t\t\t<apply><eq/>\n"
        "\t\t\t\t<ci>a1</ci>\n"
        "\t\t\t\t<apply><plus/>\n"
        "\t\t\t\t\t<ci>b1</ci>\n"
        "\t\t\t\t\t<ci>c1</ci>\n"
        "\t\t\t\t</apply>\n"
        "\t\t\t</apply>\n"
        "\t\t</math>\n";
    const std::string e2 =
        "<math xmlns=\"http://www.w3.org/1998/Math/MathML\">\n"
        "\t\t\t<apply><eq/>\n"
        "\t\t\t\t<ci>b2</ci>\n"
        "\t\t\t\t<apply><times/>\n"
        "\t\t\t\t\t<cn xmlns:cellml=\"http://www.cellml.org/cellml/2.0#\" cellml:units=\"dimensionless\">2.0</cn>\n"
        "\t\t\t\t\t<ci>d</ci>\n"
        "\t\t\t\t</apply>\n"
        "\t\t\t</apply>\n"
        "\t\t</math>\n"
        "<math xmlns=\"http://www.w3.org/1998/Math/MathML\">\n"
        "\t\t\t<apply><eq/>\n"
        "\t\t\t\t<ci>d</ci>\n"
        "\t\t\t\t<cn xmlns:cellml=\"http://www.cellml.org/cellml/2.0#\" cellml:units=\"dimensionless\" type=\"e-notation\">0.5<sep/>1</cn>\n"
        "\t\t\t</apply>\n"
        "\t\t</math>\n";

    libcellml::ParserPtr p = libcellml::Parser::create();
    libcellml::ModelPtr model = p->parseModel(fileContents("a_plus_b.cellml"));
    EXPECT_EQ(size_t(0), p->issueCount());

    std::string a = model->component("c1")->math();
    EXPECT_EQ(e1, a);

    a = model->component("c2")->math();
    EXPECT_EQ(e2, a);
}